

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O3

double msr_get_energy_units(raplcap_msr_ctx *ctx,raplcap_zone zone)

{
  long lVar1;
  
  if (ctx != (raplcap_msr_ctx *)0x0) {
    lVar1 = 0x18;
    if (zone != RAPLCAP_ZONE_DRAM) {
      lVar1 = (ulong)(zone == RAPLCAP_ZONE_PSYS) * 0x10 + 0x10;
    }
    return *(double *)((long)&ctx->cfg + lVar1);
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x313,"double msr_get_energy_units(const raplcap_msr_ctx *, raplcap_zone)");
}

Assistant:

double msr_get_energy_units(const raplcap_msr_ctx* ctx, raplcap_zone zone) {
  assert(ctx != NULL);
  double joules;
  switch (zone) {
    case RAPLCAP_ZONE_DRAM:
      joules = ctx->energy_units_dram;
      break;
    case RAPLCAP_ZONE_PSYS:
      joules = ctx->energy_units_psys;
      break;
    default:
      joules = ctx->energy_units;
      break;
  }
  raplcap_log(DEBUG, "msr_get_energy_units: joules=%.12f\n", joules);
  return joules;
}